

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LongReadsMapper.cc
# Opt level: O1

ssize_t __thiscall LongReadsMapper::read(LongReadsMapper *this,int __fd,void *__buf,size_t __nbytes)

{
  size_type in_RAX;
  ostream *poVar1;
  ssize_t sVar2;
  undefined4 in_register_00000034;
  char *pcVar3;
  uint64_t count;
  size_type local_28;
  
  pcVar3 = (char *)CONCAT44(in_register_00000034,__fd);
  local_28 = in_RAX;
  poVar1 = sdglib::OutputLog(INFO,true);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"Reading long read mappings",0x1a);
  std::ios::widen((char)poVar1->_vptr_basic_ostream[-3] + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  std::istream::read(pcVar3,(long)&this->k);
  std::istream::read(pcVar3,(long)&this->max_index_freq);
  std::istream::read(pcVar3,(long)&this->min_size);
  std::istream::read(pcVar3,(long)&this->min_chain);
  std::istream::read(pcVar3,(long)&this->max_jump);
  std::istream::read(pcVar3,(long)&this->max_delta_change);
  std::istream::read(pcVar3,(long)&local_28);
  std::vector<LongReadMapping,_std::allocator<LongReadMapping>_>::resize(&this->mappings,local_28);
  if (local_28 != 0) {
    std::istream::read(pcVar3,(long)(this->mappings).
                                    super__Vector_base<LongReadMapping,_std::allocator<LongReadMapping>_>
                                    ._M_impl.super__Vector_impl_data._M_start);
  }
  poVar1 = sdglib::OutputLog(INFO,true);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"Updating read mapping indexes!",0x1e);
  std::ios::widen((char)poVar1->_vptr_basic_ostream[-3] + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  update_indexes(this);
  poVar1 = sdglib::OutputLog(INFO,true);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"Done!",5);
  std::ios::widen((char)poVar1->_vptr_basic_ostream[-3] + (char)poVar1);
  std::ostream::put((char)poVar1);
  sVar2 = std::ostream::flush();
  return sVar2;
}

Assistant:

void LongReadsMapper::read(std::ifstream &inf) {
    sdglib::OutputLog() << "Reading long read mappings" << std::endl;

    inf.read(reinterpret_cast<char *>(&k), sizeof(k));
    inf.read(reinterpret_cast<char *>(&max_index_freq), sizeof(max_index_freq));
    inf.read(reinterpret_cast<char *>(&min_size), sizeof(min_size));
    inf.read(reinterpret_cast<char *>(&min_chain), sizeof(min_chain));
    inf.read(reinterpret_cast<char *>(&max_jump), sizeof(max_jump));
    inf.read(reinterpret_cast<char *>(&max_delta_change), sizeof(max_delta_change));

    sdglib::read_flat_vector(inf, mappings);

    sdglib::OutputLog() << "Updating read mapping indexes!" << std::endl;
    update_indexes();
    sdglib::OutputLog() << "Done!" << std::endl;
}